

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O1

int Potassco::xconvert<Clasp::Cli::ConfigKey,unsigned_int>
              (char *x,pair<Clasp::Cli::ConfigKey,_unsigned_int> *out,char **errPos,int sep)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  KV *pKVar4;
  bool bVar5;
  char *n;
  pair<Clasp::Cli::ConfigKey,_unsigned_int> temp;
  char *local_50;
  pair<Clasp::Cli::ConfigKey,_unsigned_int> local_48;
  Span<Potassco::KV> local_40;
  
  if (x == (char *)0x0) {
    return 0;
  }
  iVar2 = 0x2c;
  if (sep != 0) {
    iVar2 = sep;
  }
  local_48 = *out;
  cVar1 = *x;
  local_50 = x;
  if (cVar1 == '(') {
    local_50 = x + 1;
  }
  local_40.first = (KV *)Clasp::Cli::enumMap(Clasp::Cli::ConfigKey_const*)::map;
  local_40.size = 8;
  pKVar4 = findValue(&local_40,local_50,&local_50,",");
  bVar5 = true;
  if (pKVar4 != (KV *)0x0) {
    local_48.first = pKVar4->value;
    if (((char)iVar2 == *local_50) && (local_50[1] != '\0')) {
      iVar2 = xconvert(local_50 + 1,&local_48.second,&local_50,iVar2);
      bVar5 = iVar2 == 0;
    }
  }
  if ((cVar1 != '(') || (uVar3 = 0, *local_50 == ')')) {
    local_50 = local_50 + (cVar1 == '(');
    if (!bVar5) {
      out->second = local_48.second;
    }
    uVar3 = (uint)!bVar5;
    if ((!bVar5) || (*local_50 == '\0')) {
      out->first = local_48.first;
      uVar3 = uVar3 + 1;
    }
  }
  if (uVar3 == 0) {
    local_50 = x;
  }
  if (errPos != (char **)0x0) {
    *errPos = local_50;
  }
  return uVar3;
}

Assistant:

int xconvert(const char* x, std::pair<T, U>& out, const char** errPos = 0, int sep = def_sep) {
	if (!x) { return 0; }
	if (sep == 0) { sep = def_sep; }
	std::pair<T, U> temp(out);
	const char* n = x;
	int ps = 0;
	if (*n == '(') { ++ps; ++n; }
	int tokT = xconvert(n, temp.first, &n, sep);
	int tokU = tokT && *n == (char)sep && n[1] ? xconvert(n+1, temp.second, &n, sep) : 0;
	int sum  = 0;
	if (!ps || *n == ')') {
		n += ps;
		if (tokU)        { out.second= temp.second; ++sum; }
		if (tokU || !*n) { out.first = temp.first; ++sum; }
	}
	if (!sum) { n = x; }
	if (errPos) *errPos = n;
	return sum;
}